

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rotating_log.hpp
# Opt level: O1

void __thiscall
pstore::
basic_rotating_log<(anonymous_namespace)::mock_string_stream_traits,_(anonymous_namespace)::mock_file_system_traits>
::basic_rotating_log
          (basic_rotating_log<(anonymous_namespace)::mock_string_stream_traits,_(anonymous_namespace)::mock_file_system_traits>
           *this,string *base_name,streamoff max_size,uint num_backups,
          mock_string_stream_traits *stream_traits,mock_file_system_traits *fs_traits)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  FunctionMocker<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this_00;
  pointer pcVar3;
  undefined8 uVar4;
  streamoff sVar5;
  
  basic_logger::basic_logger(&this->super_basic_logger);
  (this->super_basic_logger).super_logger._vptr_logger =
       (_func_int **)&PTR__basic_rotating_log_00275d28;
  sVar5 = 0;
  if (0 < max_size) {
    sVar5 = max_size;
  }
  this->max_size_ = sVar5;
  paVar1 = &(this->base_name_).field_2;
  (this->base_name_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (base_name->_M_dataplus)._M_p;
  paVar2 = &base_name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&base_name->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->base_name_).field_2 + 8) = uVar4;
  }
  else {
    (this->base_name_)._M_dataplus._M_p = pcVar3;
    (this->base_name_).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->base_name_)._M_string_length = base_name->_M_string_length;
  (base_name->_M_dataplus)._M_p = (pointer)paVar2;
  base_name->_M_string_length = 0;
  (base_name->field_2)._M_local_buf[0] = '\0';
  this->num_backups_ = num_backups;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->stream_);
  this->is_open_ = false;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->stream_traits_);
  (this->stream_traits_).gmock03_open_44.super_UntypedFunctionMockerBase.
  _vptr_UntypedFunctionMockerBase = (_func_int **)&PTR__FunctionMocker_00275e08;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            (&(this->stream_traits_).gmock01_close_45.super_UntypedFunctionMockerBase);
  (this->stream_traits_).gmock01_close_45.super_UntypedFunctionMockerBase.
  _vptr_UntypedFunctionMockerBase = (_func_int **)&PTR__FunctionMocker_002760a8;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            (&(this->stream_traits_).gmock01_clear_46.super_UntypedFunctionMockerBase);
  (this->stream_traits_).gmock01_clear_46.super_UntypedFunctionMockerBase.
  _vptr_UntypedFunctionMockerBase = (_func_int **)&PTR__FunctionMocker_002760a8;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->file_system_traits_);
  (this->file_system_traits_).gmock01_exists_32.super_UntypedFunctionMockerBase.
  _vptr_UntypedFunctionMockerBase = (_func_int **)&PTR__FunctionMocker_00276168;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            (&(this->file_system_traits_).gmock01_unlink_33.super_UntypedFunctionMockerBase);
  (this->file_system_traits_).gmock01_unlink_33.super_UntypedFunctionMockerBase.
  _vptr_UntypedFunctionMockerBase = (_func_int **)&PTR__FunctionMocker_00276268;
  this_00 = &(this->file_system_traits_).gmock02_rename_34;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            (&this_00->super_UntypedFunctionMockerBase);
  (this_00->super_UntypedFunctionMockerBase)._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMocker_002762d0;
  return;
}

Assistant:

basic_rotating_log<StreamTraits, FileSystemTraits>::basic_rotating_log (
        std::string base_name, std::streamoff const max_size, unsigned const num_backups,
        StreamTraits const & stream_traits, FileSystemTraits const & fs_traits)
            : max_size_ (std::max (max_size, std::streamoff{0}))
            , base_name_{std::move (base_name)}
            , num_backups_ (num_backups)
            , stream_ ()
            , stream_traits_ (stream_traits)
            , file_system_traits_ (fs_traits) {}